

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O3

bool __thiscall
boost::detail::function::
basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
           *this,undefined8 *f,undefined8 functor)

{
  ulong __n;
  undefined8 ***__dest;
  undefined8 *__src;
  undefined8 **local_40 [2];
  ulong local_30;
  undefined4 local_28;
  
  __n = f[2];
  local_40[0] = (undefined8 ***)0x0;
  local_30 = __n;
  if (__n < 0x11) {
    __dest = local_40;
    __src = f;
  }
  else {
    __dest = (undefined8 ***)operator_new__(__n);
    __src = (undefined8 *)*f;
    local_40[0] = __dest;
  }
  memcpy(__dest,__src,__n);
  local_28 = *(undefined4 *)(f + 3);
  assign_functor<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
            (this,local_40,functor);
  if ((0x10 < local_30) && ((undefined8 ***)local_40[0] != (undefined8 ***)0x0)) {
    operator_delete__(local_40[0]);
  }
  return true;
}

Assistant:

bool 
        assign_to(FunctionObj f, function_buffer& functor, function_obj_tag) const
        {
          if (!boost::detail::function::has_empty_target(boost::addressof(f))) {
            assign_functor(f, functor, 
                           mpl::bool_<(function_allows_small_object_optimization<FunctionObj>::value)>());
            return true;
          } else {
            return false;
          }
        }